

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

uint __thiscall lsh::vector::operator*(vector *this,vector *v)

{
  uint uVar1;
  uint uVar2;
  invalid_argument *this_00;
  size_type sVar3;
  const_reference pvVar4;
  uint local_30;
  uint i;
  uint n;
  uint d;
  vector *v_local;
  vector *this_local;
  
  uVar1 = size(this);
  uVar2 = size(v);
  if (uVar1 != uVar2) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid vector size");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  i = 0;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->components_);
  for (local_30 = 0; local_30 < (uint)sVar3; local_30 = local_30 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->components_,(ulong)local_30);
    uVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&v->components_,(ulong)local_30);
    uVar1 = (uVar1 & *pvVar4) - ((uVar1 & *pvVar4) >> 1 & 0x55555555);
    uVar1 = (uVar1 & 0x33333333) + (uVar1 >> 2 & 0x33333333);
    i = ((uVar1 + (uVar1 >> 4) & 0xf0f0f0f) * 0x1010101 >> 0x18) + i;
  }
  return i;
}

Assistant:

unsigned int vector::operator*(const vector& v) const {
    if (this->size() != v.size()) {
      throw std::invalid_argument("Invalid vector size");
    }

    unsigned int d = 0;
    unsigned int n = this->components_.size();

    for (unsigned int i = 0; i < n; i++) {
      d += __builtin_popcount(this->components_[i] & v.components_[i]);
    }

    return d;
  }